

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::setupHeapTypes(TranslateToFuzzReader *this)

{
  Random *this_00;
  pointer *__args;
  pointer *ppHVar1;
  unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  *this_01;
  pointer *pppVar2;
  FeatureSet features;
  iterator iVar3;
  pointer pHVar4;
  iterator iVar5;
  char cVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *types;
  long *plVar10;
  mapped_type *pmVar11;
  pointer pHVar12;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar13;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *pvVar14;
  long lVar15;
  vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>
  *this_02;
  ulong uVar16;
  long *plVar17;
  char cVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  pointer pHVar22;
  uint uVar23;
  pointer puVar24;
  bool bVar25;
  string_view sVar26;
  undefined1 local_288 [8];
  SubTypes subTypes;
  undefined1 local_100 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> possibleHeapTypes;
  pointer local_d8;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> inhabitable;
  string __str;
  HeapType type;
  HeapTypeGenerator generator;
  BuildResult result;
  
  wasm::ModuleUtils::collectHeapTypes((Module *)local_100);
  HeapTypeGenerator::getInhabitable
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_288,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_100);
  pvVar13 = &this->interestingHeapTypes;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_move_assign(pvVar13,local_288);
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288,
                    (long)subTypes.types.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_288);
  }
  features.features = (this->wasm->features).features;
  if ((features.features >> 10 & 1) != 0) {
    this_00 = &this->random;
    uVar7 = Random::upTo(this_00,(this->fuzzParams->super_FuzzParams).MAX_NEW_GC_TYPES);
    HeapTypeGenerator::create((HeapTypeGenerator *)&type,this_00,features,(ulong)uVar7);
    wasm::TypeBuilder::build();
    if (result.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _M_first._M_storage._M_storage[0x10] == '\x01') {
      Fatal::Fatal((Fatal *)local_288);
      ppHVar1 = &subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppHVar1,"Failed to build heap types: ",0x1c);
      wasm::operator<<((ostream *)ppHVar1,
                       result.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       ._M_u._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppHVar1," at index ",10);
      Fatal::operator<<((Fatal *)local_288,
                        (unsigned_long *)
                        &generator.supertypeIndices.
                         super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Fatal::~Fatal((Fatal *)local_288);
    }
    types = std::
            get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                      ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        *)&generator.supertypeIndices.
                           super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    HeapTypeGenerator::makeInhabitable
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&stack0xffffffffffffff28,
               types);
    for (puVar24 = local_d8;
        puVar24 !=
        (pointer)inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start; puVar24 = puVar24 + 1) {
      __str.field_2._8_8_ =
           (puVar24->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if ((Function *)0x7c < (ulong)__str.field_2._8_8_) {
        iVar3._M_current =
             (this->interestingHeapTypes).
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->interestingHeapTypes).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)pvVar13,iVar3,
                     (HeapType *)((long)&__str.field_2 + 8));
        }
        else {
          (iVar3._M_current)->id = __str.field_2._8_8_;
          (this->interestingHeapTypes).
          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        uVar7 = Random::upTo(this_00,2);
        if (uVar7 == 0) {
          uVar21 = (long)(this->interestingHeapTypes).
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(this->interestingHeapTypes).
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3;
          cVar18 = '\x01';
          if (9 < uVar21) {
            uVar16 = uVar21;
            cVar6 = '\x04';
            do {
              cVar18 = cVar6;
              if (uVar16 < 100) {
                cVar18 = cVar18 + -2;
                goto LAB_00134d7f;
              }
              if (uVar16 < 1000) {
                cVar18 = cVar18 + -1;
                goto LAB_00134d7f;
              }
              if (uVar16 < 10000) goto LAB_00134d7f;
              bVar25 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              cVar6 = cVar18 + '\x04';
            } while (bVar25);
            cVar18 = cVar18 + '\x01';
          }
LAB_00134d7f:
          ppHVar1 = &inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
          std::__cxx11::string::_M_construct((ulong)ppHVar1,cVar18);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)inhabitable.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (uint)__str._M_dataplus._M_p,uVar21);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)ppHVar1,0,(char *)0x0,0x1b4eb8);
          local_288 = (undefined1  [8])
                      &subTypes.types.
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          plVar17 = plVar10 + 2;
          if ((pointer *)*plVar10 == (pointer *)plVar17) {
            subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar17;
            subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)plVar10[3];
            subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 *(undefined4 *)((long)plVar10 + 0x1c);
          }
          else {
            subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar17;
            local_288 = (undefined1  [8])*plVar10;
          }
          subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)plVar10[1];
          *plVar10 = (long)plVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          sVar26 = (string_view)
                   wasm::IString::interned
                             (subTypes.types.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start,local_288,0);
          pmVar11 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->wasm->typeNames,(key_type *)((long)&__str.field_2 + 8));
          (pmVar11->name).super_IString.str = sVar26;
          if (local_288 !=
              (undefined1  [8])
              &subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_finish) {
            operator_delete((void *)local_288,
                            (ulong)((long)&(subTypes.types.
                                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
          }
          if (inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length)
          {
            operator_delete(inhabitable.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            __str._M_string_length + 1);
          }
        }
      }
    }
    if (local_d8 != (pointer)0x0) {
      operator_delete(local_d8,(long)inhabitable.
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)local_d8);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [result.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _M_first._M_storage._M_storage[0x10]]._M_data)
              ((anon_class_1_0_00000001 *)local_288,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)&generator.supertypeIndices.
                   super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (generator.subtypeIndices.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(generator.subtypeIndices.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)generator.supertypeIndices.
                            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)generator.subtypeIndices.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&generator);
    wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&type);
  }
  SubTypes::SubTypes((SubTypes *)local_288,pvVar13);
  pHVar12 = (this->interestingHeapTypes).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start;
  possibleHeapTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->interestingHeapTypes).
       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (pHVar12 !=
      possibleHeapTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    this_01 = &this->interestingHeapSubTypes;
    __args = &generator.supertypeIndices.
              super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      generator.supertypeIndices.
      super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar12->id;
      pvVar13 = SubTypes::getImmediateSubTypes
                          ((SubTypes *)local_288,
                           (HeapType)
                           generator.supertypeIndices.
                           super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pHVar4 = (pvVar13->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pHVar22 = (pvVar13->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                     _M_impl.super__Vector_impl_data._M_start; pHVar22 != pHVar4;
          pHVar22 = pHVar22 + 1) {
        type.id = pHVar22->id;
        pvVar14 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,(key_type *)__args);
        iVar3._M_current = *(HeapType **)(pvVar14 + 8);
        if (iVar3._M_current == *(HeapType **)(pvVar14 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar14,iVar3,&type);
        }
        else {
          (iVar3._M_current)->id = type.id;
          *(HeapType **)(pvVar14 + 8) = iVar3._M_current + 1;
        }
      }
      iVar8 = wasm::HeapType::getShared();
      bVar25 = iVar8 == 0;
      uVar9 = wasm::HeapType::getKind();
      if (4 < uVar9) goto LAB_001352b9;
      uVar21 = (ulong)((uint)bVar25 * 4);
      uVar20 = (uint)bVar25 * 4 + 0x28;
      uVar23 = (uint)bVar25 * 4 + 0x20;
      switch(uVar9) {
      case 0:
        uVar9 = 0x209;
        pcVar19 = "unexpected kind";
        goto LAB_00135465;
      case 1:
        type.id = uVar21 | 0x10;
        pvVar14 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar3._M_current = *(HeapType **)(pvVar14 + 8);
        if (iVar3._M_current == *(HeapType **)(pvVar14 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar14,iVar3,(HeapType *)__args);
        }
        else {
          (iVar3._M_current)->id =
               (uintptr_t)
               generator.supertypeIndices.
               super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(HeapType **)(pvVar14 + 8) = iVar3._M_current + 1;
        }
        break;
      case 2:
        type.id = uVar21 | 0x38;
        pvVar14 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar3._M_current = *(HeapType **)(pvVar14 + 8);
        if (iVar3._M_current == *(HeapType **)(pvVar14 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar14,iVar3,(HeapType *)__args);
        }
        else {
          (iVar3._M_current)->id =
               (uintptr_t)
               generator.supertypeIndices.
               super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(HeapType **)(pvVar14 + 8) = iVar3._M_current + 1;
        }
        type.id = (uintptr_t)uVar20;
        pvVar14 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar3._M_current = *(HeapType **)(pvVar14 + 8);
        if (iVar3._M_current == *(HeapType **)(pvVar14 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar14,iVar3,(HeapType *)__args);
        }
        else {
          (iVar3._M_current)->id =
               (uintptr_t)
               generator.supertypeIndices.
               super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(HeapType **)(pvVar14 + 8) = iVar3._M_current + 1;
        }
        type.id = (uintptr_t)uVar23;
        pvVar14 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar3._M_current = *(HeapType **)(pvVar14 + 8);
        if (iVar3._M_current == *(HeapType **)(pvVar14 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar14,iVar3,(HeapType *)__args);
        }
        else {
          (iVar3._M_current)->id =
               (uintptr_t)
               generator.supertypeIndices.
               super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(HeapType **)(pvVar14 + 8) = iVar3._M_current + 1;
        }
        plVar10 = (long *)wasm::HeapType::getStruct();
        lVar15 = *plVar10;
        if (plVar10[1] != lVar15) {
          uVar21 = 0;
          do {
            iVar8 = (int)uVar21;
            if (*(int *)(lVar15 + 0xc + uVar21 * 0x10) != 0) {
              type.id = (uintptr_t)
                        generator.supertypeIndices.
                        super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              iVar5._M_current =
                   (this->mutableStructFields).
                   super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              generator._0_4_ = iVar8;
              if (iVar5._M_current ==
                  (this->mutableStructFields).
                  super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>
                ::_M_realloc_insert<std::pair<wasm::HeapType,unsigned_int>>
                          ((vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>
                            *)&this->mutableStructFields,iVar5,
                           (pair<wasm::HeapType,_unsigned_int> *)&type);
              }
              else {
                ((iVar5._M_current)->first).id =
                     (uintptr_t)
                     generator.supertypeIndices.
                     super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                *(ulong *)&(iVar5._M_current)->second = CONCAT44(generator._4_4_,iVar8);
                pppVar2 = &(this->mutableStructFields).
                           super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *pppVar2 = *pppVar2 + 1;
              }
            }
            uVar21 = (ulong)(iVar8 + 1);
            lVar15 = *plVar10;
          } while (uVar21 < (ulong)(plVar10[1] - lVar15 >> 4));
        }
        break;
      case 3:
        type.id = uVar21 | 0x40;
        pvVar14 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar3._M_current = *(HeapType **)(pvVar14 + 8);
        if (iVar3._M_current == *(HeapType **)(pvVar14 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar14,iVar3,(HeapType *)__args);
        }
        else {
          (iVar3._M_current)->id =
               (uintptr_t)
               generator.supertypeIndices.
               super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(HeapType **)(pvVar14 + 8) = iVar3._M_current + 1;
        }
        type.id = (uintptr_t)uVar20;
        pvVar14 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar3._M_current = *(HeapType **)(pvVar14 + 8);
        if (iVar3._M_current == *(HeapType **)(pvVar14 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar14,iVar3,(HeapType *)__args);
        }
        else {
          (iVar3._M_current)->id =
               (uintptr_t)
               generator.supertypeIndices.
               super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(HeapType **)(pvVar14 + 8) = iVar3._M_current + 1;
        }
        type.id = (uintptr_t)uVar23;
        pvVar14 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar3._M_current = *(HeapType **)(pvVar14 + 8);
        if (iVar3._M_current == *(HeapType **)(pvVar14 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar14,iVar3,(HeapType *)__args);
        }
        else {
          (iVar3._M_current)->id =
               (uintptr_t)
               generator.supertypeIndices.
               super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(HeapType **)(pvVar14 + 8) = iVar3._M_current + 1;
        }
        wasm::HeapType::getArray();
        if (generator._4_4_ != 0) {
          iVar3._M_current =
               (this->mutableArrays).
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->mutableArrays).
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>
                      ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&this->mutableArrays
                       ,iVar3,(HeapType *)__args);
          }
          else {
            (iVar3._M_current)->id =
                 (uintptr_t)
                 generator.supertypeIndices.
                 super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (this->mutableArrays).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
        }
        break;
      case 4:
        uVar9 = 0x207;
        pcVar19 = "TODO: cont";
LAB_00135465:
        wasm::handle_unreachable
                  (pcVar19,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,uVar9);
      }
LAB_001352b9:
      pHVar12 = pHVar12 + 1;
    } while (pHVar12 !=
             possibleHeapTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pHVar12 = (this->interestingHeapTypes).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start;
  pHVar22 = (this->interestingHeapTypes).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pHVar12 != pHVar22) {
    do {
      generator.supertypeIndices.
      super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar12->id;
      iVar8 = wasm::HeapType::getKind();
      if (iVar8 == 2) {
        plVar10 = (long *)wasm::HeapType::getStruct();
        lVar15 = *plVar10;
        if (plVar10[1] != lVar15) {
          uVar21 = 0;
          do {
            this_02 = (vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>
                       *)std::__detail::
                         _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&this->typeStructFields,
                                      (key_type *)(uVar21 * 0x10 + lVar15));
            type.id = (uintptr_t)
                      generator.supertypeIndices.
                      super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            iVar8 = (int)uVar21;
            iVar5._M_current = *(pair<wasm::HeapType,_unsigned_int> **)(this_02 + 8);
            generator._0_4_ = iVar8;
            if (iVar5._M_current == *(pair<wasm::HeapType,_unsigned_int> **)(this_02 + 0x10)) {
              std::
              vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>
              ::_M_realloc_insert<std::pair<wasm::HeapType,unsigned_int>>
                        (this_02,iVar5,(pair<wasm::HeapType,_unsigned_int> *)&type);
            }
            else {
              ((iVar5._M_current)->first).id =
                   (uintptr_t)
                   generator.supertypeIndices.
                   super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              *(ulong *)&(iVar5._M_current)->second = CONCAT44(generator._4_4_,iVar8);
              *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 0x10;
            }
            uVar21 = (ulong)(iVar8 + 1);
            lVar15 = *plVar10;
          } while (uVar21 < (ulong)(plVar10[1] - lVar15 >> 4));
        }
      }
      else {
        iVar8 = wasm::HeapType::getKind();
        if (iVar8 == 3) {
          wasm::HeapType::getArray();
          pvVar14 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                    std::__detail::
                    _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->typeArrays,(key_type *)&type);
          iVar3._M_current = *(HeapType **)(pvVar14 + 8);
          if (iVar3._M_current == *(HeapType **)(pvVar14 + 0x10)) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>
                      (pvVar14,iVar3,
                       (HeapType *)
                       &generator.supertypeIndices.
                        super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            (iVar3._M_current)->id =
                 (uintptr_t)
                 generator.supertypeIndices.
                 super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(HeapType **)(pvVar14 + 8) = iVar3._M_current + 1;
          }
        }
      }
      pHVar12 = pHVar12 + 1;
    } while (pHVar12 != pHVar22);
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&subTypes.types.
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288,
                    (long)subTypes.types.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_288);
  }
  if (local_100 != (undefined1  [8])0x0) {
    operator_delete((void *)local_100,
                    (long)possibleHeapTypes.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_100);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupHeapTypes() {
  // Start with any existing heap types in the module, which may exist in any
  // initial content we began with.
  auto possibleHeapTypes = ModuleUtils::collectHeapTypes(wasm);

  // Filter away uninhabitable heap types, that is, heap types that we cannot
  // construct, like a type with a non-nullable reference to itself.
  interestingHeapTypes = HeapTypeGenerator::getInhabitable(possibleHeapTypes);

  // For GC, also generate random types.
  if (wasm.features.hasGC()) {
    auto generator = HeapTypeGenerator::create(
      random, wasm.features, upTo(fuzzParams->MAX_NEW_GC_TYPES));
    auto result = generator.builder.build();
    if (auto* err = result.getError()) {
      Fatal() << "Failed to build heap types: " << err->reason << " at index "
              << err->index;
    }

    // Make the new types inhabitable. This process modifies existing types, so
    // it leaves more available compared to HeapTypeGenerator::getInhabitable.
    // We run that before on existing content, which may have instructions that
    // use the types, as editing them is not trivial, and for new types here we
    // are free to modify them so we keep as many as we can.
    auto inhabitable = HeapTypeGenerator::makeInhabitable(*result);
    for (auto type : inhabitable) {
      // Trivial types are already handled specifically in e.g.
      // getSingleConcreteType(), and we avoid adding them here as then we'd
      // need to add code to avoid uninhabitable combinations of them (like a
      // non-nullable bottom heap type).
      if (!type.isBottom() && !type.isBasic()) {
        interestingHeapTypes.push_back(type);
        if (oneIn(2)) {
          // Add a name for this type.
          wasm.typeNames[type].name =
            "generated_type$" + std::to_string(interestingHeapTypes.size());
        }
      }
    }
  }

  // Compute subtypes ahead of time. It is more efficient to do this all at once
  // now, rather than lazily later.
  SubTypes subTypes(interestingHeapTypes);
  for (auto type : interestingHeapTypes) {
    for (auto subType : subTypes.getImmediateSubTypes(type)) {
      interestingHeapSubTypes[type].push_back(subType);
    }
    // Basic types must be handled directly, since subTypes doesn't look at
    // those.
    auto share = type.getShared();
    auto struct_ = HeapTypes::struct_.getBasic(share);
    auto array = HeapTypes::array.getBasic(share);
    auto eq = HeapTypes::eq.getBasic(share);
    auto any = HeapTypes::any.getBasic(share);
    auto func = HeapTypes::func.getBasic(share);
    switch (type.getKind()) {
      case HeapTypeKind::Func:
        interestingHeapSubTypes[func].push_back(type);
        break;
      case HeapTypeKind::Struct: {
        interestingHeapSubTypes[struct_].push_back(type);
        interestingHeapSubTypes[eq].push_back(type);
        interestingHeapSubTypes[any].push_back(type);
        // Note the mutable fields.
        auto& fields = type.getStruct().fields;
        for (Index i = 0; i < fields.size(); i++) {
          if (fields[i].mutable_) {
            mutableStructFields.push_back(StructField{type, i});
          }
        }
        break;
      }
      case HeapTypeKind::Array:
        interestingHeapSubTypes[array].push_back(type);
        interestingHeapSubTypes[eq].push_back(type);
        interestingHeapSubTypes[any].push_back(type);
        if (type.getArray().element.mutable_) {
          mutableArrays.push_back(type);
        }
        break;
      case HeapTypeKind::Cont:
        WASM_UNREACHABLE("TODO: cont");
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }
  }

  // Compute struct and array fields.
  for (auto type : interestingHeapTypes) {
    if (type.isStruct()) {
      auto& fields = type.getStruct().fields;
      for (Index i = 0; i < fields.size(); i++) {
        typeStructFields[fields[i].type].push_back(StructField{type, i});
      }
    } else if (type.isArray()) {
      typeArrays[type.getArray().element.type].push_back(type);
    }
  }
}